

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O3

bool __thiscall
Clasp::SharedMinimizeData::setMode
          (SharedMinimizeData *this,MinimizeMode m,wsum_t *bound,uint32 boundSize)

{
  uint uVar1;
  long lVar2;
  pointer plVar3;
  long lVar4;
  uint uVar5;
  long lVar6;
  byte bVar7;
  long lVar8;
  
  this->mode_ = m;
  if (bound != (wsum_t *)0x0 && boundSize != 0) {
    LOCK();
    (this->gCount_).super___atomic_base<unsigned_int>._M_i = 0;
    UNLOCK();
    this->optGen_ = 0;
    uVar1 = (this->adjust_).ebo_.size;
    uVar5 = boundSize;
    if (uVar1 < boundSize) {
      uVar5 = uVar1;
    }
    if (uVar1 != 0) {
      if (uVar1 < boundSize) {
        boundSize = uVar1;
      }
      lVar6 = 0;
      bVar7 = 0;
      do {
        lVar2 = (this->adjust_).ebo_.buf[lVar6];
        lVar8 = bound[lVar6] - lVar2;
        lVar4 = 0x7fffffffffffffff;
        if (bound[lVar6] <= lVar2 + 0x7fffffffffffffff) {
          lVar4 = lVar8;
        }
        if (lVar2 < 0) {
          lVar8 = lVar4;
        }
        lVar2 = this->lower_[lVar6].super___atomic_base<long>._M_i;
        lVar4 = lVar8 - lVar2;
        if (!(bool)(-1 < lVar4 | bVar7)) {
          return false;
        }
        this->up_[0].ebo_.buf[lVar6] = lVar8;
        bVar7 = bVar7 | (lVar8 != lVar2 && -1 < lVar4);
        lVar6 = lVar6 + 1;
      } while (boundSize != (uint)lVar6);
    }
    uVar1 = this->up_[0].ebo_.size;
    if (uVar5 != uVar1) {
      plVar3 = this->up_[0].ebo_.buf;
      do {
        plVar3[uVar5] = 0x7fffffffffffffff;
        uVar5 = uVar5 + 1;
      } while (uVar1 != uVar5);
    }
  }
  return true;
}

Assistant:

bool SharedMinimizeData::setMode(MinimizeMode m, const wsum_t* bound, uint32 boundSize)  {
	mode_ = m;
	if (boundSize && bound) {
		SumVec& opt = up_[0];
		bool    ok  = false;
		gCount_     = 0;
		optGen_     = 0;
		boundSize   = std::min(boundSize, numRules());
		for (uint32 i = 0, end = boundSize; i != end; ++i) {
			wsum_t B = bound[i], a = adjust(i);
			B        = a >= 0 || (maxBound() + a) >= B ? B - a : maxBound();
			wsum_t d = B - lower_[i];
			if (d < 0 && !ok) { return false; }
			opt[i]   = B;
			ok       = ok || d > 0;
		}
		for (uint32 i = boundSize, end = (uint32)opt.size(); i != end; ++i) { opt[i] = maxBound(); }
	}
	return true;
}